

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer.cpp
# Opt level: O3

Layer * ncnn::create_layer(int index)

{
  int iVar1;
  undefined **ppuVar2;
  Layer *pLVar3;
  undefined1 *puVar4;
  
  if (99 < (uint)index) {
    return (Layer *)0x0;
  }
  iVar1 = cpu_support_x86_avx512();
  if (iVar1 == 0) {
    iVar1 = cpu_support_x86_fma();
    if (iVar1 == 0) {
      iVar1 = cpu_support_x86_avx();
      if (iVar1 == 0) {
        puVar4 = (undefined1 *)&layer_registry;
      }
      else {
        puVar4 = layer_registry_avx;
      }
      ppuVar2 = (undefined **)((long)puVar4 + (ulong)(uint)index * 2 * 8);
      goto LAB_0017ba99;
    }
    puVar4 = layer_registry_fma;
  }
  else {
    puVar4 = layer_registry_avx512;
  }
  ppuVar2 = (undefined **)(puVar4 + (ulong)(uint)index * 0x10);
LAB_0017ba99:
  if ((code *)ppuVar2[1] == (code *)0x0) {
    pLVar3 = (Layer *)0x0;
  }
  else {
    pLVar3 = (Layer *)(*(code *)ppuVar2[1])(0);
    pLVar3->typeindex = index;
  }
  return pLVar3;
}

Assistant:

Layer* create_layer(int index)
{
    if (index < 0 || index >= layer_registry_entry_count)
        return 0;

    // clang-format off
    // *INDENT-OFF*
    layer_creator_func layer_creator = 0;
#if NCNN_RUNTIME_CPU && NCNN_AVX512
    if (ncnn::cpu_support_x86_avx512())
    {
        layer_creator = layer_registry_avx512[index].creator;
    }
    else
#endif// NCNN_RUNTIME_CPU && NCNN_AVX512
#if NCNN_RUNTIME_CPU && NCNN_FMA
    if (ncnn::cpu_support_x86_fma())
    {
        layer_creator = layer_registry_fma[index].creator;
    }
    else
#endif// NCNN_RUNTIME_CPU && NCNN_FMA
#if NCNN_RUNTIME_CPU && NCNN_AVX
    if (ncnn::cpu_support_x86_avx())
    {
        layer_creator = layer_registry_avx[index].creator;
    }
    else
#endif // NCNN_RUNTIME_CPU && NCNN_AVX
#if NCNN_RUNTIME_CPU && NCNN_LSX
    if (ncnn::cpu_support_loongarch_lsx())
    {
        layer_creator = layer_registry_lsx[index].creator;
    }
    else
#endif // NCNN_RUNTIME_CPU && NCNN_LSX
#if NCNN_RUNTIME_CPU && NCNN_MSA
    if (ncnn::cpu_support_mips_msa())
    {
        layer_creator = layer_registry_msa[index].creator;
    }
    else
#endif // NCNN_RUNTIME_CPU && NCNN_MSA
#if NCNN_RUNTIME_CPU && NCNN_RVV
    if (ncnn::cpu_support_riscv_v())
    {
        layer_creator = layer_registry_rvv[index].creator;
    }
    else
#endif // NCNN_RUNTIME_CPU && NCNN_RVV
    {
        layer_creator = layer_registry[index].creator;
    }
    // *INDENT-ON*
    // clang-format on
    if (!layer_creator)
        return 0;

    Layer* layer = layer_creator(0);
    layer->typeindex = index;
    return layer;
}